

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::EmitPropDelete
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  Scope *symScope;
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  PropertyId PVar4;
  uint uVar5;
  RegSlot value;
  Scope **ppSVar6;
  undefined4 *puVar7;
  Scope *scope;
  Type *pTVar8;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 aVar9;
  int i;
  int index;
  undefined1 local_98 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  PropertyId local_58;
  DynamicLoadKind DStack_54;
  PropertyId envIndex;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 local_4c;
  ByteCodeGenerator *local_48;
  undefined4 *local_40;
  RegSlot local_38;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 local_34;
  
  local_58 = -1;
  ppSVar6 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar6 = &this->globalScope;
  }
  symScope = *ppSVar6;
  recList._40_8_ = sym;
  local_48 = this;
  local_38 = lhsLocation;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x14d1,"(symScope)","symScope");
    if (!bVar2) {
LAB_0080af01:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
    local_40 = puVar7;
  }
  else {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       local_48->alloc;
  local_98 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  this_00 = &local_48->m_writer;
  local_34.index = 0xffffffff;
  scope = (Scope *)0x0;
  do {
    scope = FindScopeForSym(local_48,symScope,scope,&local_58,funcInfo);
    if (scope == this->globalScope) {
      local_34.index = 0xfffffffd;
    }
    else if (local_58 == -1) {
      if (scope->func != funcInfo) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x14de,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar2) goto LAB_0080af01;
        *local_40 = 0;
      }
      local_34 = (anon_union_4_2_6390a042_for_DynamicLoadRecord_2)scope->location;
    }
    if (scope == symScope) {
      if (recList._40_8_ == 0) {
        PVar4 = pid->m_propertyId;
LAB_0080ac57:
        if ((local_48->flags & 0x404) == 0) {
          uVar5 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar4);
          Js::ByteCodeWriter::Property(this_00,DeleteRootFld,local_38,0xfffffffd,uVar5,false);
        }
        else {
          uVar5 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar4);
          Js::ByteCodeWriter::ScopedProperty
                    (this_00,ScopedDeleteFld,local_38,uVar5,
                     local_48->forceStrictModeForClassComputedPropertyName);
        }
      }
      else {
        if ((*(byte *)(recList._40_8_ + 0x42) & 8) != 0) {
          PVar4 = Symbol::EnsurePosition((Symbol *)recList._40_8_,local_48);
          goto LAB_0080ac57;
        }
        Symbol::EnsureScopeSlot((Symbol *)recList._40_8_,local_48,funcInfo);
        Js::ByteCodeWriter::Reg1(this_00,LdFalse,local_38);
      }
      if ((int)recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer
          == 0) goto LAB_0080aec3;
      aVar9.index = Js::ByteCodeWriter::DefineLabel(this_00);
      Js::ByteCodeWriter::Br(this_00,aVar9.index);
      index = 0;
      local_34.index = aVar9.index;
      break;
    }
    if ((scope == (Scope *)0x0) || (uVar3 = *(ushort *)&scope->field_0x44, (uVar3 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_40 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x14e8,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar2) goto LAB_0080af01;
      *local_40 = 0;
      uVar3 = *(ushort *)&scope->field_0x44;
    }
    if ((uVar3 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_40 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x14e9,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar2) goto LAB_0080af01;
      *local_40 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)&stack0xffffffffffffffac);
    envIndex = Js::ByteCodeWriter::DefineLabel(this_00);
    if (recList._40_8_ == 0) {
      PVar4 = pid->m_propertyId;
    }
    else {
      PVar4 = Symbol::EnsurePosition((Symbol *)recList._40_8_,local_48);
    }
    uVar5 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar4);
    if (scope->scopeType == ScopeType_With) {
      if (local_58 == -1) {
        Js::ByteCodeWriter::BrProperty(this_00,BrOnHasProperty,envIndex,local_34.instance,uVar5);
        DStack_54 = LocalWith;
        local_4c = local_34;
      }
      else {
        aVar9.index = local_58 + 1;
        Js::ByteCodeWriter::BrEnvProperty(this_00,BrOnHasEnvProperty,envIndex,uVar5,aVar9.index);
        DStack_54 = EnvWith;
        local_4c.index = aVar9.index;
      }
    }
    else if (local_58 == -1) {
      Js::ByteCodeWriter::BrLocalProperty(this_00,BrOnHasLocalProperty,envIndex,uVar5);
      DStack_54 = Local;
      local_4c = local_34;
    }
    else {
      aVar9.index = local_58 + 1;
      Js::ByteCodeWriter::BrEnvProperty(this_00,BrOnHasLocalEnvProperty,envIndex,uVar5,aVar9.index);
      DStack_54 = Env;
      local_4c.index = aVar9.index;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)local_98,0);
    ((anon_union_4_2_6390a042_for_DynamicLoadRecord_2 *)
    ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           _vptr_ReadOnlyList +
    (long)(int)recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer
    * 0xc + 8))->index = (uint32)local_4c;
    *(ulong *)((long)recList.
                     super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                     _vptr_ReadOnlyList +
              (long)(int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer * 0xc) = CONCAT44(envIndex,DStack_54);
    recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
    _0_4_ = (int)recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer + 1;
  } while( true );
LAB_0080acd7:
  if (recList._40_8_ == 0) {
    PVar4 = pid->m_propertyId;
  }
  else {
    PVar4 = Symbol::EnsurePosition((Symbol *)recList._40_8_,local_48);
  }
  uVar5 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar4);
  pTVar8 = JsUtil::
           List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_98,index);
  Js::ByteCodeWriter::MarkLabel(this_00,pTVar8->label);
  pTVar8 = JsUtil::
           List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_98,index);
  switch(pTVar8->kind) {
  case Local:
    Js::ByteCodeWriter::ElementU(this_00,DeleteLocalFld_ReuseLoc,local_38,uVar5);
    goto LAB_0080ae9b;
  case Env:
    value = FuncInfo::AcquireTmpRegister(funcInfo);
    pTVar8 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_98,index);
    Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,value,(pTVar8->field_2).index);
    Js::ByteCodeWriter::Property(this_00,DeleteFld_ReuseLoc,local_38,value,uVar5,false);
    break;
  case LocalWith:
    value = FuncInfo::AcquireTmpRegister(funcInfo);
    pTVar8 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_98,index);
    Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,value,(pTVar8->field_2).instance);
    Js::ByteCodeWriter::Property(this_00,DeleteFld_ReuseLoc,local_38,value,uVar5,false);
    break;
  case EnvWith:
    value = FuncInfo::AcquireTmpRegister(funcInfo);
    pTVar8 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_98,index);
    Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,value,(pTVar8->field_2).index);
    Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,value,value);
    Js::ByteCodeWriter::Property(this_00,DeleteFld_ReuseLoc,local_38,value,uVar5,false);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_40 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1554,"((0))","(0)");
    if (bVar2) {
      *local_40 = 0;
      goto LAB_0080ae9b;
    }
    goto LAB_0080af01;
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,value);
LAB_0080ae9b:
  if (index == (int)recList.
                    super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                    buffer + -1) {
    Js::ByteCodeWriter::MarkLabel(this_00,local_34.index);
LAB_0080aec3:
    local_98 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
    if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
        _vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                 recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 _16_8_,recList.
                        super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                        ._vptr_ReadOnlyList,
                 (long)(int)recList.
                            super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                            .alloc * 0xc);
    }
    return;
  }
  Js::ByteCodeWriter::Br(this_00,local_34.index);
  index = index + 1;
  goto LAB_0080acd7;
}

Assistant:

void ByteCodeGenerator::EmitPropDelete(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo)
{
    // If sym belongs to a parent frame, delete it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just return false.

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            scopeLocation = ByteCodeGenerator::RootObjectRegister;
        }
        else if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & (fscrEval | fscrImplicitThis))
        {
            this->m_writer.ScopedProperty(Js::OpCode::ScopedDeleteFld, lhsLocation,
                funcInfo->FindOrAddReferencedPropertyId(propertyId), forceStrictModeForClassComputedPropertyName);
        }
        else
        {
            this->m_writer.Property(Js::OpCode::DeleteRootFld, lhsLocation, ByteCodeGenerator::RootObjectRegister,
                funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }
    }
    else
    {
        // The delete will look like a non-local reference, so make sure a slot is reserved.
        sym->EnsureScopeSlot(this, funcInfo);
        this->m_writer.Reg1(Js::OpCode::LdFalse, lhsLocation);
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
            Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->m_writer.ElementU(Js::OpCode::DeleteLocalFld_ReuseLoc, lhsLocation, propertyIndex);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }
}